

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O2

int getnum(char **fmt,int df)

{
  char *pcVar1;
  char *pcVar2;
  
  if (0xfffffff5 < (int)**fmt - 0x3aU) {
    df = 0;
    pcVar1 = *fmt;
    do {
      pcVar2 = pcVar1 + 1;
      *fmt = pcVar2;
      df = df * 10 + (int)*pcVar1 + -0x30;
      if (9 < (int)*pcVar2 - 0x30U) {
        return df;
      }
      pcVar1 = pcVar2;
    } while (df < 0xccccccc);
  }
  return df;
}

Assistant:

static int getnum (const char **fmt, int df) {
  if (!digit(**fmt))  /* no number? */
    return df;  /* return default value */
  else {
    int a = 0;
    do {
      a = a*10 + (*((*fmt)++) - '0');
    } while (digit(**fmt) && a <= ((int)MAXSIZE - 9)/10);
    return a;
  }
}